

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

double __thiscall Alice::ObliviousMultiplication(Alice *this,long arg1,long arg2)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  long lVar7;
  Message MVar8;
  int local_6c;
  long local_58;
  long local_50;
  undefined1 local_48 [8];
  Message msg_from_Bob;
  Message msg_for_Bob;
  double result;
  long arg2_local;
  long arg1_local;
  Alice *this_local;
  
  Message::Message((Message *)&msg_from_Bob.scalar2);
  Message::Message((Message *)local_48);
  iVar1 = (this->super_Party).rc;
  sVar4 = std::vector<long,_std::allocator<long>_>::size(&(this->super_Party).Randoms);
  if (sVar4 < (ulong)(long)(iVar1 + 3)) {
    local_6c = 0;
  }
  else {
    local_6c = (this->super_Party).rc;
  }
  (this->super_Party).rc = local_6c;
  pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                     (&(this->super_Party).Randoms,(long)(this->super_Party).rc);
  msg_from_Bob.scalar2 = arg1 - *pvVar5;
  std::vector<long,_std::allocator<long>_>::operator[]
            (&(this->super_Party).Randoms,(long)((this->super_Party).rc + 2));
  Server::Send(this->srv,(Message *)&msg_from_Bob.scalar2);
  MVar8 = Server::Receive(this->srv);
  local_58 = MVar8.scalar1;
  local_48 = (undefined1  [8])local_58;
  local_50 = MVar8.scalar2;
  msg_from_Bob.scalar1 = local_50;
  pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                     (&(this->super_Party).Randoms,(long)(this->super_Party).rc);
  lVar6 = (arg1 + *pvVar5) * (long)local_48;
  pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                     (&(this->super_Party).Randoms,(long)((this->super_Party).rc + 1));
  lVar2 = *pvVar5;
  pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                     (&(this->super_Party).Randoms,(long)((this->super_Party).rc + 2));
  lVar7 = (arg2 + *pvVar5) * msg_from_Bob.scalar1;
  pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                     (&(this->super_Party).Randoms,(long)((this->super_Party).rc + 3));
  lVar3 = *pvVar5;
  iVar1 = (this->super_Party).rc;
  sVar4 = std::vector<long,_std::allocator<long>_>::size(&(this->super_Party).Randoms);
  (this->super_Party).rc = (int)((ulong)(long)(iVar1 + 4) % sVar4);
  return (double)(lVar7 + lVar3) / 2.0 + (double)(lVar6 + lVar2) / 2.0 + (double)(arg1 * arg2);
}

Assistant:

double Alice::ObliviousMultiplication(long arg1, long arg2)
{
    double result = arg1 * arg2; //Alice locally computes x'y'
    Message msg_for_Bob, msg_from_Bob;
    rc = ((rc + 3) <= Randoms.size() ? rc : 0);
    msg_for_Bob.scalar1 = arg1 - Randoms[rc];     //for computing x'y"
    msg_for_Bob.scalar2 = arg2 - Randoms[rc + 2]; //for computing x"y'
    srv->Send(msg_for_Bob);
    msg_from_Bob = srv->Receive();
    result += ((arg1 + Randoms[rc]) * (msg_from_Bob.scalar1) + Randoms[rc + 1]) /(double)2;
    result += ((arg2 + Randoms[rc + 2]) * (msg_from_Bob.scalar2) + Randoms[rc + 3]) /(double)2;
    rc = (rc+4) % Randoms.size();
    // printf("Alice's Share: %f\n", result);
    return result;
}